

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O2

BitMatrix * __thiscall
ZXing::Pdf417::Writer::encode
          (BitMatrix *__return_storage_ptr__,Writer *this,wstring *contents,int width,int height)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int margin;
  int iVar4;
  long lVar5;
  uint uVar6;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  temp;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  originalScale;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  temp_1;
  BarcodeMatrix resultMatrix;
  
  margin = 0x1e;
  if (-1 < this->_margin) {
    margin = this->_margin;
  }
  iVar2 = 2;
  if (-1 < this->_ecLevel) {
    iVar2 = this->_ecLevel;
  }
  Encoder::generateBarcodeLogic
            (&resultMatrix,
             (this->_encoder)._M_t.
             super___uniq_ptr_impl<ZXing::Pdf417::Encoder,_std::default_delete<ZXing::Pdf417::Encoder>_>
             ._M_t.
             super__Tuple_impl<0UL,_ZXing::Pdf417::Encoder_*,_std::default_delete<ZXing::Pdf417::Encoder>_>
             .super__Head_base<0UL,_ZXing::Pdf417::Encoder_*,_false>._M_head_impl,contents,iVar2);
  originalScale.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  originalScale.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  originalScale.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BarcodeMatrix::getScaledMatrix(&resultMatrix,1,4,&originalScale);
  uVar6 = ((originalScale.
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->super__Bvector_base<std::allocator<bool>_>).
          _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  lVar5 = (long)((originalScale.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_p -
          (long)((originalScale.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p;
  uVar3 = ((long)originalScale.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)originalScale.
                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  bVar1 = uVar3 <= (ulong)uVar6 + lVar5 * 8 == width < height;
  if (bVar1) {
    temp.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    temp.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RotateArray(&originalScale,&temp);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator=(&originalScale,&temp);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::~vector(&temp);
    uVar6 = ((originalScale.
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->super__Bvector_base<std::allocator<bool>_>
            )._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    lVar5 = (long)((originalScale.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                  _M_finish.super__Bit_iterator_base._M_p -
            (long)((originalScale.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                  _M_start.super__Bit_iterator_base._M_p;
    uVar3 = ((long)originalScale.
                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)originalScale.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  }
  iVar4 = width / (int)(uVar6 + (int)lVar5 * 8);
  iVar2 = height / (int)uVar3;
  if (iVar4 < iVar2) {
    iVar2 = iVar4;
  }
  if (iVar2 < 2) {
    BitMatrixFromBitArray(__return_storage_ptr__,&originalScale,margin);
  }
  else {
    temp.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    temp.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BarcodeMatrix::getScaledMatrix(&resultMatrix,iVar2,iVar2 * 4,&temp);
    if (bVar1) {
      temp_1.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      temp_1.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      temp_1.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      RotateArray(&temp,&temp_1);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::operator=(&temp,&temp_1);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector(&temp_1);
    }
    BitMatrixFromBitArray(__return_storage_ptr__,&temp,margin);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::~vector(&temp);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&originalScale);
  std::vector<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>::~vector
            (&resultMatrix._matrix);
  return __return_storage_ptr__;
}

Assistant:

BitMatrix
Writer::encode(const std::wstring& contents, int width, int height) const
{
	int margin = _margin >= 0 ? _margin : WHITE_SPACE;
	int ecLevel = _ecLevel >= 0 ? _ecLevel : DEFAULT_ERROR_CORRECTION_LEVEL;

	BarcodeMatrix resultMatrix = _encoder->generateBarcodeLogic(contents, ecLevel);
	int aspectRatio = 4; // keep in sync with MODULE_RATIO in PDFEncoder.cpp
	std::vector<std::vector<bool>> originalScale;
	resultMatrix.getScaledMatrix(1, aspectRatio, originalScale);
	bool rotated = false;
	if ((height > width) != (originalScale[0].size() < originalScale.size())) {
		std::vector<std::vector<bool>> temp;
		RotateArray(originalScale, temp);
		originalScale = temp;
		rotated = true;
	}

	int scaleX = width / Size(originalScale[0]);
	int scaleY = height / Size(originalScale);

	int scale;
	if (scaleX < scaleY) {
		scale = scaleX;
	}
	else {
		scale = scaleY;
	}

	if (scale > 1) {
		std::vector<std::vector<bool>> scaledMatrix;
		resultMatrix.getScaledMatrix(scale, scale * aspectRatio, scaledMatrix);
		if (rotated) {
			std::vector<std::vector<bool>> temp;
			RotateArray(scaledMatrix, temp);
			scaledMatrix = temp;
		}
		return BitMatrixFromBitArray(scaledMatrix, margin);
	}
	else {
		return BitMatrixFromBitArray(originalScale, margin);
	}
}